

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat_extra.hpp
# Opt level: O0

mat3x2f * operator*(mat3x2f *a,mat2f *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  mat2f *in_RDX;
  mat3x2f *in_RSI;
  mat3x2f *in_RDI;
  int k;
  int j;
  int i;
  uint local_1c;
  int local_18;
  uint local_14;
  
  mat3x2f::mat3x2f((mat3x2f *)0x1836d0);
  for (local_14 = 0; (int)local_14 < 3; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      for (local_1c = 0; (int)local_1c < 2; local_1c = local_1c + 1) {
        pfVar3 = mat3x2f::operator[](in_RSI,local_14);
        fVar1 = pfVar3[(int)local_1c];
        pfVar3 = mat2f::operator[](in_RDX,local_1c);
        fVar2 = pfVar3[local_18];
        pfVar3 = mat3x2f::operator[](in_RDI,local_14);
        pfVar3[local_18] = fVar1 * fVar2 + pfVar3[local_18];
      }
    }
  }
  return in_RDI;
}

Assistant:

inline mat3x2f operator * (const mat3x2f& a, const mat2f& b)
{
	mat3x2f res;
	for (int i=0; i<3; ++i)
		for (int j=0; j<2; ++j)
			for (int k=0; k<2; ++k)
				res[i][j] += a[i][k] * b[k][j];
	return res;
}